

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common_v2.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::Finalize(idx2_file_v2 *Idx2)

{
  array<idx2::array<signed_char>_> *Array;
  undefined8 *puVar1;
  undefined4 *puVar2;
  char *pcVar3;
  long *plVar4;
  idx2_err_code *piVar5;
  char cVar6;
  char *pcVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  bool bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  name_map *pnVar15;
  byte *pbVar16;
  idx2_err_code iVar17;
  long lVar18;
  long lVar19;
  byte *pbVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  str pcVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  char *unaff_R14;
  uint uVar29;
  char *unaff_R15;
  long *in_FS_OFFSET;
  bool bVar30;
  error<idx2::idx2_err_code> eVar31;
  int aiStackY_248 [88];
  undefined4 uVar32;
  char *local_d0;
  str local_c8;
  char *local_b0;
  array<signed_char> local_88;
  array<signed_char> *local_50;
  int local_48 [6];
  
  lVar27 = (Idx2->Dimensions).Size;
  bVar30 = lVar27 == 0;
  if (!bVar30) {
    pbVar16 = (Idx2->Dimensions).Buffer.Data;
    unaff_R14 = (char *)0x0;
    do {
      lVar18 = *(long *)(unaff_R14 + (long)(pbVar16 + 0x18));
      if ((lVar18 == 0) && (*(int *)(unaff_R14 + (long)(pbVar16 + 0x30)) == 0)) {
        *(char **)(*in_FS_OFFSET + -0x300) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0x36;
        iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal == SizeZero) goto LAB_0010612b;
        lVar27 = 0x28;
        goto LAB_001060c9;
      }
      if ((0 < lVar18) && (0 < *(int *)(unaff_R14 + (long)(pbVar16 + 0x30)))) {
        *(char **)(*in_FS_OFFSET + -0x300) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0x38;
        iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal == DimensionsRepeated) goto LAB_001060e2;
        lVar27 = 0x28;
        goto LAB_00106016;
      }
      if ((lVar18 == 1) || (*(int *)(unaff_R14 + (long)(pbVar16 + 0x30)) == 1)) {
        *(char **)(*in_FS_OFFSET + -0x300) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0x3a;
        iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal == DimensionTooSmall) goto LAB_00106036;
        lVar27 = 0x28;
        goto LAB_00105fb5;
      }
      unaff_R14 = unaff_R14 + 0x38;
      bVar30 = lVar27 * 0x38 - (long)unaff_R14 == 0;
    } while (!bVar30);
  }
  uVar23 = 0;
  goto LAB_001061fa;
  while (pcVar3 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar27),
        lVar27 = lVar27 + 0x18, *pcVar3 != '\x02') {
LAB_001060c9:
    if (lVar27 == 0x3b8) {
      iVar17 = __Invalid__;
      goto LAB_0010612b;
    }
  }
  iVar17 = SizeZero;
LAB_0010612b:
  local_b0 = "Dimension %c is zero\n";
  uVar32 = 0x36;
  if (idx2_err_code_s::NameMap.Arr[0].ItemVal == iVar17) {
    uVar23 = 0x10002;
    goto LAB_00106146;
  }
  lVar27 = 0;
  do {
    if (lVar27 == 0x390) goto LAB_001074ca;
    lVar18 = lVar27 + 0x18;
    piVar5 = &idx2_err_code_s::NameMap.Arr[1].ItemVal + lVar27;
    lVar27 = lVar18;
  } while (*piVar5 != iVar17);
  uVar23 = 0x10002;
  goto LAB_00106175;
  while (pcVar3 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar27),
        lVar27 = lVar27 + 0x18, *pcVar3 != '\x13') {
LAB_00106016:
    if (lVar27 == 0x3b8) {
      iVar17 = __Invalid__;
      goto LAB_001060e2;
    }
  }
  iVar17 = DimensionsRepeated;
LAB_001060e2:
  local_b0 = "Dimension %c is both numerical and categorical\n";
  uVar32 = 0x38;
  if (idx2_err_code_s::NameMap.Arr[0].ItemVal == iVar17) {
    uVar23 = 0x10013;
    goto LAB_00106146;
  }
  lVar27 = 0;
  do {
    if (lVar27 == 0x390) goto LAB_001074ca;
    lVar18 = lVar27 + 0x18;
    piVar5 = &idx2_err_code_s::NameMap.Arr[1].ItemVal + lVar27;
    lVar27 = lVar18;
  } while (*piVar5 != iVar17);
  uVar23 = 0x10013;
LAB_00106175:
  pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
LAB_00106181:
  local_c8 = pnVar15->Arr[0].Name.field_0.Ptr;
  lVar27 = *in_FS_OFFSET;
  iVar13 = snprintf((char *)(lVar27 + -0x700),0x400,"%.*s (file %s, line %d): ",
                    (ulong)(uint)pnVar15->Arr[0].Name.Size,local_c8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                    ,uVar32);
  unaff_R15 = (char *)(lVar27 + -0x700) + iVar13;
  snprintf(unaff_R15,0x400 - (long)iVar13,local_b0,
           (ulong)(uint)(int)unaff_R14[(long)(pbVar16 + 0x34)]);
  unaff_R14 = local_b0;
LAB_001061fa:
  uVar29 = (uint)unaff_R15;
  if (bVar30) {
    *(char **)(*in_FS_OFFSET + -0x300) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0x3d;
    unaff_R14 = "";
    uVar23 = 0;
  }
  if ((char)uVar23 != '\0') {
    uVar29 = uVar23 | 0x100;
    *(undefined4 *)(*in_FS_OFFSET + -0xfc) = 0xc6;
    *(char **)(*in_FS_OFFSET + -0x2f8) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    goto LAB_001074a8;
  }
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  local_88.Buffer.Data = (byte *)0x0;
  local_88.Buffer.Bytes = 0;
  local_88.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_88.Alloc = (allocator *)&Mallocator()::Instance;
  lVar27 = (long)(Idx2->IdxTemplate).Full.Size;
  bVar30 = lVar27 < 1;
  local_88.Size = (i64)local_88.Buffer.Data;
  local_88.Capacity = local_88.Buffer.Bytes;
  if (0 < lVar27) {
    Array = &(Idx2->IdxTemplate).Suffix;
    local_50 = &(Idx2->IdxTemplate).Prefix;
    puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x300);
    puVar2 = (undefined4 *)(*in_FS_OFFSET + -0x100);
    bVar10 = true;
    pcVar3 = (char *)(*in_FS_OFFSET + -0x700);
    bVar30 = false;
    do {
      if ((Idx2->IdxTemplate).Full.Size < lVar27) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      bVar11 = (Idx2->IdxTemplate).Full.field_0.Ptr[lVar27 + -1];
      if (bVar11 == '|') {
        if (!bVar10) {
          *puVar1 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar2 = 0x5a;
          pnVar15 = &idx2_err_code_s::NameMap;
          iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal == SyntaxError) goto LAB_00106892;
          lVar27 = 0x28;
          goto LAB_00106830;
        }
        if ((Idx2->IdxTemplate).Suffix.Capacity <= (Idx2->IdxTemplate).Suffix.Size) {
          GrowCapacity<idx2::array<signed_char>>(Array,0);
        }
        pbVar20 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
        lVar18 = (Idx2->IdxTemplate).Suffix.Size;
        (Idx2->IdxTemplate).Suffix.Size = lVar18 + 1;
        lVar18 = lVar18 * 0x30;
        pbVar16 = pbVar20 + lVar18 + 0x10;
        *(allocator **)pbVar16 = local_88.Buffer.Alloc;
        *(i64 *)(pbVar16 + 8) = local_88.Size;
        *(i64 *)(pbVar16 + 0x10) = local_88.Capacity;
        *(allocator **)(pbVar16 + 0x18) = local_88.Alloc;
        plVar4 = (long *)(pbVar20 + lVar18);
        *plVar4 = (long)local_88.Buffer.Data;
        plVar4[1] = local_88.Buffer.Bytes;
        plVar4[2] = (long)local_88.Buffer.Alloc;
        plVar4[3] = local_88.Size;
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        if (Mallocator()::Instance == '\0') {
          iVar13 = __cxa_guard_acquire(&Mallocator()::Instance);
          bVar10 = false;
          goto LAB_001067db;
        }
        bVar10 = false;
LAB_001064aa:
        local_88.Buffer.Data = (byte *)0x0;
        local_88.Buffer.Bytes = 0;
        local_88.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
        local_88.Alloc = (allocator *)&Mallocator()::Instance;
        local_88.Size = (i64)local_88.Buffer.Data;
        local_88.Capacity = local_88.Buffer.Bytes;
      }
      else {
        if (bVar11 == ':') {
          if (bVar10) {
            if ((Idx2->IdxTemplate).Suffix.Capacity <= (Idx2->IdxTemplate).Suffix.Size) {
              GrowCapacity<idx2::array<signed_char>>(Array,0);
            }
            pbVar20 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
            lVar18 = (Idx2->IdxTemplate).Suffix.Size;
            (Idx2->IdxTemplate).Suffix.Size = lVar18 + 1;
            lVar18 = lVar18 * 0x30;
            pbVar16 = pbVar20 + lVar18 + 0x10;
            *(allocator **)pbVar16 = local_88.Buffer.Alloc;
            *(i64 *)(pbVar16 + 8) = local_88.Size;
            *(i64 *)(pbVar16 + 0x10) = local_88.Capacity;
            *(allocator **)(pbVar16 + 0x18) = local_88.Alloc;
            plVar4 = (long *)(pbVar20 + lVar18);
            *plVar4 = (long)local_88.Buffer.Data;
            plVar4[1] = local_88.Buffer.Bytes;
            plVar4[2] = (long)local_88.Buffer.Alloc;
            plVar4[3] = local_88.Size;
            if (Mallocator()::Instance == '\0') {
              Finalize();
            }
            if (Mallocator()::Instance == '\0') {
              iVar13 = __cxa_guard_acquire(&Mallocator()::Instance);
LAB_001067db:
              if (iVar13 != 0) {
                __cxa_guard_release(&Mallocator()::Instance);
              }
            }
            goto LAB_001064aa;
          }
          *puVar1 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar2 = 0x52;
          pnVar15 = &idx2_err_code_s::NameMap;
          iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal == SyntaxError) goto LAB_001068cf;
          lVar27 = 0x28;
          goto LAB_00106879;
        }
        iVar22 = (int)(char)bVar11;
        iVar13 = isalpha(iVar22);
        if ((iVar13 == 0) || (iVar13 = islower(iVar22), iVar13 == 0)) {
          *puVar1 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar2 = 100;
          iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SyntaxError) {
            lVar18 = 0x28;
            do {
              if (lVar18 == 0x3b8) {
                iVar17 = __Invalid__;
                goto LAB_00106599;
              }
              pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
              lVar18 = lVar18 + 0x18;
            } while (*pcVar7 != '\x1e');
            iVar17 = SyntaxError;
          }
LAB_00106599:
          pnVar15 = &idx2_err_code_s::NameMap;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
            lVar18 = 0;
            do {
              lVar26 = lVar18;
              if (lVar26 == 0x390) goto LAB_001074ca;
              lVar18 = lVar26 + 0x18;
            } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar26] != iVar17);
            pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar26);
          }
          iVar13 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",
                            (ulong)(uint)pnVar15->Arr[0].Name.Size,pnVar15->Arr[0].Name.field_0.Ptr,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                            ,100);
          local_d0 = "Unsupported character (%c) in the indexing template\n";
          snprintf(pcVar3 + iVar13,0x400 - (long)iVar13,
                   "Unsupported character (%c) in the indexing template\n",iVar22);
          local_c8 = (str)0x1001e;
LAB_0010661c:
          bVar8 = false;
        }
        else {
          if ((Idx2->CharToIntMap[(long)(char)bVar11 + -0x61] == -1) &&
             (lVar18 = (Idx2->Dimensions).Size, 0 < lVar18)) {
            pbVar16 = (Idx2->Dimensions).Buffer.Data + 0x34;
            lVar26 = 0;
            do {
              if (bVar11 == *pbVar16) {
                Idx2->CharToIntMap[(long)(char)bVar11 + -0x61] = (i8)lVar26;
                break;
              }
              lVar26 = lVar26 + 1;
              pbVar16 = pbVar16 + 0x38;
            } while (lVar18 != lVar26);
          }
          if (Idx2->CharToIntMap[(long)(char)bVar11 + -0x61] == -1) {
            *puVar1 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
            ;
            *puVar2 = 0x78;
            iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
            if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionsTooMany) {
              lVar18 = 0x28;
              do {
                if (lVar18 == 0x3b8) {
                  iVar17 = __Invalid__;
                  goto LAB_00106713;
                }
                pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
                lVar18 = lVar18 + 0x18;
              } while (*pcVar7 != '\x06');
              iVar17 = DimensionsTooMany;
            }
LAB_00106713:
            pnVar15 = &idx2_err_code_s::NameMap;
            if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
              lVar18 = 0;
              do {
                lVar26 = lVar18;
                if (lVar26 == 0x390) goto LAB_001074ca;
                lVar18 = lVar26 + 0x18;
              } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar26] != iVar17);
              pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar26);
            }
            iVar13 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",
                              (ulong)(uint)pnVar15->Arr[0].Name.Size,
                              pnVar15->Arr[0].Name.field_0.Ptr,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                              ,0x78);
            local_d0 = "The indexing template contains an unknown dimension: %c\n";
            snprintf(pcVar3 + iVar13,0x400 - (long)iVar13,
                     "The indexing template contains an unknown dimension: %c\n",iVar22);
            local_c8 = (str)0x10006;
            goto LAB_0010661c;
          }
          if (bVar10) {
            if (local_88.Capacity <= local_88.Size) {
              GrowCapacity<signed_char>(&local_88,0);
            }
            pbVar20 = (byte *)local_88.Size;
            bVar11 = Idx2->CharToIntMap[(long)(char)bVar11 + -0x61];
            local_88.Size = (i64)(local_88.Size + 1);
            pbVar16 = local_88.Buffer.Data;
          }
          else {
            if ((Idx2->IdxTemplate).Prefix.Capacity <= (Idx2->IdxTemplate).Prefix.Size) {
              GrowCapacity<signed_char>(local_50,0);
            }
            bVar11 = Idx2->CharToIntMap[(long)(char)bVar11 + -0x61];
            pbVar16 = (Idx2->IdxTemplate).Prefix.Buffer.Data;
            pbVar20 = (byte *)(Idx2->IdxTemplate).Prefix.Size;
            (Idx2->IdxTemplate).Prefix.Size = (i64)(pbVar20 + 1);
          }
          pbVar16[(long)pbVar20] = bVar11;
          bVar8 = true;
        }
        if (!bVar8) break;
      }
      bVar30 = lVar27 < 2;
      bVar8 = 1 < lVar27;
      lVar27 = lVar27 + -1;
    } while (bVar8);
  }
  goto LAB_0010696a;
  while (pcVar3 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar27),
        lVar27 = lVar27 + 0x18, *pcVar3 != '\x14') {
LAB_00105fb5:
    if (lVar27 == 0x3b8) {
      iVar17 = __Invalid__;
      goto LAB_00106036;
    }
  }
  iVar17 = DimensionTooSmall;
LAB_00106036:
  local_b0 = "Dimension %c is too small (1), consider removing it\n";
  uVar32 = 0x3a;
  if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
    lVar27 = 0;
    do {
      if (lVar27 == 0x390) goto LAB_001074ca;
      lVar18 = lVar27 + 0x18;
      piVar5 = &idx2_err_code_s::NameMap.Arr[1].ItemVal + lVar27;
      lVar27 = lVar18;
    } while (*piVar5 != iVar17);
    uVar23 = 0x10014;
    goto LAB_00106175;
  }
  uVar23 = 0x10014;
LAB_00106146:
  pnVar15 = &idx2_err_code_s::NameMap;
  goto LAB_00106181;
  while (pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar27),
        lVar27 = lVar27 + 0x18, *pcVar7 != '\x1e') {
LAB_00106830:
    if (lVar27 == 0x3b8) {
      iVar17 = __Invalid__;
      goto LAB_00106892;
    }
  }
  iVar17 = SyntaxError;
LAB_00106892:
  local_d0 = "Only one | allowed in the indexing template\n";
  uVar32 = 0x5a;
  if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
    lVar27 = 0;
    do {
      if (lVar27 == 0x390) goto LAB_001074ca;
      lVar18 = lVar27 + 0x18;
      piVar5 = &idx2_err_code_s::NameMap.Arr[1].ItemVal + lVar27;
      lVar27 = lVar18;
      uVar32 = 0x5a;
    } while (*piVar5 != iVar17);
    goto LAB_00106908;
  }
  goto LAB_0010690f;
  while (pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar27),
        lVar27 = lVar27 + 0x18, *pcVar7 != '\x1e') {
LAB_00106879:
    if (lVar27 == 0x3b8) {
      iVar17 = __Invalid__;
      goto LAB_001068cf;
    }
  }
  iVar17 = SyntaxError;
LAB_001068cf:
  local_d0 = ": cannot occur after | in the indexing template\n";
  uVar32 = 0x52;
  if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
    lVar27 = 0;
    do {
      if (lVar27 == 0x390) goto LAB_001074ca;
      lVar18 = lVar27 + 0x18;
      piVar5 = &idx2_err_code_s::NameMap.Arr[1].ItemVal + lVar27;
      lVar27 = lVar18;
      uVar32 = 0x52;
    } while (*piVar5 != iVar17);
LAB_00106908:
    pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
  }
LAB_0010690f:
  iVar13 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",(ulong)(uint)pnVar15->Arr[0].Name.Size,
                    pnVar15->Arr[0].Name.field_0.Ptr,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                    ,uVar32);
  snprintf(pcVar3 + iVar13,0x400 - (long)iVar13,local_d0);
  local_c8 = (str)0x1001e;
LAB_0010696a:
  if (bVar30) {
    if (0 < local_88.Size) {
      if ((Idx2->IdxTemplate).Suffix.Capacity <= (Idx2->IdxTemplate).Suffix.Size) {
        GrowCapacity<idx2::array<signed_char>>(&(Idx2->IdxTemplate).Suffix,0);
      }
      pbVar20 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
      lVar27 = (Idx2->IdxTemplate).Suffix.Size;
      (Idx2->IdxTemplate).Suffix.Size = lVar27 + 1;
      lVar27 = lVar27 * 0x30;
      auVar9._8_8_ = local_88.Buffer.Bytes;
      auVar9._0_8_ = local_88.Buffer.Data;
      auVar9._16_8_ = local_88.Buffer.Alloc;
      auVar9._24_8_ = local_88.Size;
      pbVar16 = pbVar20 + lVar27 + 0x10;
      *(allocator **)pbVar16 = local_88.Buffer.Alloc;
      *(i64 *)(pbVar16 + 8) = local_88.Size;
      *(i64 *)(pbVar16 + 0x10) = local_88.Capacity;
      *(allocator **)(pbVar16 + 0x18) = local_88.Alloc;
      *(undefined1 (*) [32])(pbVar20 + lVar27) = auVar9;
      if (0 < (Idx2->IdxTemplate).Prefix.Size) {
        *(char **)(*in_FS_OFFSET + -0x300) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0x87;
        pnVar15 = &idx2_err_code_s::NameMap;
        iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SyntaxError) {
          lVar27 = 0x28;
          do {
            if (lVar27 == 0x3b8) {
              iVar17 = __Invalid__;
              goto LAB_001072fe;
            }
            pcVar3 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar27);
            lVar27 = lVar27 + 0x18;
          } while (*pcVar3 != '\x1e');
          iVar17 = SyntaxError;
        }
LAB_001072fe:
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
          lVar27 = 0;
          do {
            lVar18 = lVar27;
            if (lVar18 == 0x390) {
LAB_001074ca:
              __assert_fail("It != End(EnumS.NameMap)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../idx2Common.h"
                            ,0x38,"stref idx2::ToString(idx2_err_code)");
            }
            lVar27 = lVar18 + 0x18;
          } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar18] != iVar17);
          pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar18);
        }
        lVar27 = *in_FS_OFFSET;
        iVar13 = snprintf((char *)(lVar27 + -0x700),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)pnVar15->Arr[0].Name.Size,pnVar15->Arr[0].Name.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                          ,0x87);
        local_d0 = "Invalid indexing template syntax\n";
        snprintf((char *)(lVar27 + -0x700) + iVar13,0x400 - (long)iVar13,
                 "Invalid indexing template syntax\n");
        local_c8._0_4_ = 0x1001e;
        goto LAB_001073fd;
      }
    }
    lVar27 = (Idx2->Dimensions).Size;
    bVar30 = 0 < lVar27;
    if (0 < lVar27) {
      lVar27 = *in_FS_OFFSET;
      lVar18 = *in_FS_OFFSET;
      bVar30 = true;
      lVar26 = *in_FS_OFFSET;
      lVar28 = 0;
      do {
        uVar25 = (ulong)(char)(Idx2->Dimensions).Buffer.Data[lVar28 * 0x38 + 0x34];
        cVar6 = Idx2->CharToIntMap[uVar25 - 0x61];
        if (cVar6 == -1) {
          *(char **)(lVar27 + -0x300) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *(undefined4 *)(lVar18 + -0x100) = 0x8f;
          iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionsTooMany) {
            lVar21 = 0x28;
            do {
              if (lVar21 == 0x3b8) {
                iVar17 = __Invalid__;
                goto LAB_00106afb;
              }
              pcVar3 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar21);
              lVar21 = lVar21 + 0x18;
            } while (*pcVar3 != '\x06');
            iVar17 = DimensionsTooMany;
          }
LAB_00106afb:
          pnVar15 = &idx2_err_code_s::NameMap;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
            lVar21 = 0;
            do {
              lVar19 = lVar21;
              if (lVar19 == 0x390) goto LAB_001074ca;
              lVar21 = lVar19 + 0x18;
            } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar19] != iVar17);
            pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar19);
          }
          iVar13 = snprintf((char *)(lVar26 + -0x700),0x400,"%.*s (file %s, line %d): ",
                            (ulong)(uint)pnVar15->Arr[0].Name.Size,pnVar15->Arr[0].Name.field_0.Ptr,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                            ,0x8f);
          snprintf((char *)(lVar26 + -0x700) + iVar13,0x400 - (long)iVar13,
                   "Dimension %c does not appear in the indexing template\n",uVar25 & 0xffffffff);
          local_c8 = (str)0x10006;
          local_d0 = "Dimension %c does not appear in the indexing template\n";
        }
        if (cVar6 == -1) break;
        lVar28 = lVar28 + 1;
        lVar21 = (Idx2->Dimensions).Size;
        bVar30 = lVar28 < lVar21;
      } while (lVar28 < lVar21);
    }
    if (!bVar30) {
      lVar27 = (Idx2->IdxTemplate).Suffix.Size;
      bVar30 = 0 < lVar27;
      if (0 < lVar27) {
        puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x300);
        puVar2 = (undefined4 *)(*in_FS_OFFSET + -0x100);
        bVar30 = true;
        pcVar3 = (char *)(*in_FS_OFFSET + -0x700);
        lVar27 = 0;
        do {
          pbVar16 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
          lVar18 = *(long *)(pbVar16 + lVar27 * 0x30 + 0x18);
          if (lVar18 < 4) {
            pbVar16 = pbVar16 + lVar27 * 0x30;
            bVar10 = true;
            if (lVar18 == 3) {
              pcVar7 = *(char **)pbVar16;
              if ((*pcVar7 == pcVar7[1]) || (*pcVar7 == pcVar7[2] || pcVar7[1] == pcVar7[2])) {
                *puVar1 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                ;
                *puVar2 = 0x9f;
                iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
                if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionsRepeated) {
                  lVar18 = 0x28;
                  do {
                    if (lVar18 == 0x3b8) {
                      iVar17 = __Invalid__;
                      goto LAB_00106ead;
                    }
                    pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
                    lVar18 = lVar18 + 0x18;
                  } while (*pcVar7 != '\x13');
                  iVar17 = DimensionsRepeated;
                }
LAB_00106ead:
                pnVar15 = &idx2_err_code_s::NameMap;
                if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
                  lVar18 = 0;
                  do {
                    lVar26 = lVar18;
                    if (lVar26 == 0x390) goto LAB_001074ca;
                    lVar18 = lVar26 + 0x18;
                  } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar26] != iVar17);
                  pnVar15 = (name_map *)
                            ((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar26);
                }
                pcVar24 = pnVar15->Arr[0].Name.field_0.Ptr;
                uVar23 = pnVar15->Arr[0].Name.Size;
                uVar32 = 0x9f;
LAB_00106f19:
                iVar13 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",(ulong)uVar23,pcVar24,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                                  ,uVar32);
                local_d0 = "Repeated dimensions on level %d\n";
                snprintf(pcVar3 + iVar13,0x400 - (long)iVar13,"Repeated dimensions on level %d\n");
                local_c8 = (str)0x10013;
                goto LAB_00106f63;
              }
            }
            else if (lVar18 == 2) {
              pcVar7 = *(char **)pbVar16;
              if (*pcVar7 == pcVar7[1]) {
                *puVar1 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                ;
                *puVar2 = 0x9c;
                iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
                if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionsRepeated) {
                  lVar18 = 0x28;
                  do {
                    if (lVar18 == 0x3b8) {
                      iVar17 = __Invalid__;
                      goto LAB_00106ee5;
                    }
                    pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
                    lVar18 = lVar18 + 0x18;
                  } while (*pcVar7 != '\x13');
                  iVar17 = DimensionsRepeated;
                }
LAB_00106ee5:
                pnVar15 = &idx2_err_code_s::NameMap;
                if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
                  lVar18 = 0;
                  do {
                    lVar26 = lVar18;
                    if (lVar26 == 0x390) goto LAB_001074ca;
                    lVar18 = lVar26 + 0x18;
                  } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar26] != iVar17);
                  pnVar15 = (name_map *)
                            ((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar26);
                }
                pcVar24 = pnVar15->Arr[0].Name.field_0.Ptr;
                uVar23 = pnVar15->Arr[0].Name.Size;
                uVar32 = 0x9c;
                goto LAB_00106f19;
              }
            }
            else if (lVar18 == 0) {
              *puVar1 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
              ;
              *puVar2 = 0x99;
              iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
              if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SyntaxError) {
                lVar18 = 0x28;
                do {
                  if (lVar18 == 0x3b8) {
                    iVar17 = __Invalid__;
                    goto LAB_00106e29;
                  }
                  pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
                  lVar18 = lVar18 + 0x18;
                } while (*pcVar7 != '\x1e');
                iVar17 = SyntaxError;
              }
LAB_00106e29:
              pnVar15 = &idx2_err_code_s::NameMap;
              if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
                lVar18 = 0;
                do {
                  lVar26 = lVar18;
                  if (lVar26 == 0x390) goto LAB_001074ca;
                  lVar18 = lVar26 + 0x18;
                } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar26] != iVar17);
                pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar26)
                ;
              }
              iVar13 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",
                                (ulong)(uint)pnVar15->Arr[0].Name.Size,
                                pnVar15->Arr[0].Name.field_0.Ptr,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                                ,0x99);
              local_d0 = ": or | needs to be followed by a dimension in the indexing template\n";
              snprintf(pcVar3 + iVar13,0x400 - (long)iVar13,
                       ": or | needs to be followed by a dimension in the indexing template\n");
              local_c8 = (str)0x1001e;
              goto LAB_00106f63;
            }
          }
          else {
            *puVar1 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
            ;
            *puVar2 = 0x97;
            iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
            if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionsTooMany) {
              lVar18 = 0x28;
              do {
                if (lVar18 == 0x3b8) {
                  iVar17 = __Invalid__;
                  goto LAB_00106cd5;
                }
                pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar18);
                lVar18 = lVar18 + 0x18;
              } while (*pcVar7 != '\x06');
              iVar17 = DimensionsTooMany;
            }
LAB_00106cd5:
            pnVar15 = &idx2_err_code_s::NameMap;
            if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
              lVar18 = 0;
              do {
                lVar26 = lVar18;
                if (lVar26 == 0x390) goto LAB_001074ca;
                lVar18 = lVar26 + 0x18;
              } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar26] != iVar17);
              pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar26);
            }
            iVar13 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",
                              (ulong)(uint)pnVar15->Arr[0].Name.Size,
                              pnVar15->Arr[0].Name.field_0.Ptr,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                              ,0x97);
            local_d0 = "More than three dimensions in level %d\n";
            snprintf(pcVar3 + iVar13,0x400 - (long)iVar13,"More than three dimensions in level %d\n"
                    );
            local_c8 = (str)0x10006;
LAB_00106f63:
            bVar10 = false;
          }
          if (!bVar10) break;
          lVar27 = lVar27 + 1;
          lVar18 = (Idx2->IdxTemplate).Suffix.Size;
          bVar30 = lVar27 < lVar18;
        } while (lVar27 < lVar18);
      }
      if (!bVar30) {
        local_48[0] = 1;
        local_48[1] = 1;
        local_48[2] = 1;
        local_48[3] = 1;
        local_48[4] = 1;
        local_48[5] = 1;
        lVar27 = (long)(Idx2->IdxTemplate).Full.Size;
        if (0 < lVar27) {
          pcVar24 = (Idx2->IdxTemplate).Full.field_0.Ptr;
          lVar18 = 0;
          do {
            iVar22 = (int)pcVar24[lVar18];
            iVar13 = isalpha(iVar22);
            if (iVar13 != 0) {
              if (5 < (long)Idx2->CharToIntMap[(long)iVar22 + -0x61]) goto LAB_0010750e;
              local_48[Idx2->CharToIntMap[(long)iVar22 + -0x61]] =
                   local_48[Idx2->CharToIntMap[(long)iVar22 + -0x61]] << 1;
            }
            lVar18 = lVar18 + 1;
          } while (lVar27 != lVar18);
        }
        lVar27 = (Idx2->Dimensions).Size;
        bVar30 = 0 < lVar27;
        if (0 < lVar27) {
          lVar27 = *in_FS_OFFSET;
          lVar18 = *in_FS_OFFSET;
          bVar30 = true;
          pcVar3 = (char *)(*in_FS_OFFSET + -0x700);
          lVar26 = 0;
          do {
            pbVar16 = (Idx2->Dimensions).Buffer.Data;
            lVar28 = lVar26 * 0x38;
            uVar25 = *(ulong *)(pbVar16 + lVar28 + 0x18);
            if ((long)uVar25 < 1) {
              uVar25 = (ulong)*(uint *)(pbVar16 + lVar28 + 0x30);
            }
            if ((int)uVar25 == 0) {
              iVar13 = 1;
            }
            else {
              uVar25 = (long)(int)uVar25 - 1;
              lVar21 = 0x3f;
              if (uVar25 != 0) {
                for (; uVar25 >> lVar21 == 0; lVar21 = lVar21 + -1) {
                }
              }
              iVar13 = (int)(1L << (-((byte)lVar21 ^ 0x3f) & 0x3f));
              if (uVar25 == 0) {
                iVar13 = 1;
              }
            }
            if (lVar26 == 6) {
LAB_0010750e:
              __assert_fail("Idx < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../Common.h"
                            ,0x2d0,"t &idx2::v6<int>::operator[](int) const [t = int]");
            }
            iVar22 = local_48[lVar26];
            uVar25 = (ulong)iVar22;
            if (iVar22 < iVar13) {
              *(undefined8 *)(lVar27 + -0x300) =
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
              ;
              *(undefined4 *)(lVar18 + -0x100) = 0xb6;
              iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
              if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionMismatched) {
                lVar21 = 0x28;
                do {
                  if (lVar21 == 0x3b8) {
                    iVar17 = __Invalid__;
                    goto LAB_00107166;
                  }
                  pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar21);
                  lVar21 = lVar21 + 0x18;
                } while (*pcVar7 != '\x05');
                iVar17 = DimensionMismatched;
              }
LAB_00107166:
              pnVar15 = &idx2_err_code_s::NameMap;
              if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
                lVar21 = 0;
                do {
                  lVar19 = lVar21;
                  if (lVar19 == 0x390) goto LAB_001074ca;
                  lVar21 = lVar19 + 0x18;
                } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar19] != iVar17);
                pnVar15 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar19)
                ;
              }
              iVar14 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",
                                (ulong)(uint)pnVar15->Arr[0].Name.Size,
                                pnVar15->Arr[0].Name.field_0.Ptr,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                                ,0xb6);
              lVar21 = 0x3f;
              if ((long)iVar13 != 0) {
                for (; (ulong)(long)iVar13 >> lVar21 == 0; lVar21 = lVar21 + -1) {
                }
              }
              bVar11 = pbVar16[lVar28 + 0x34];
              lVar28 = 0x3f;
              if (uVar25 != 0) {
                for (; uVar25 >> lVar28 == 0; lVar28 = lVar28 + -1) {
                }
              }
              uVar23 = (-(uint)(iVar13 == 0) | (uint)lVar21) - (-(uint)(iVar22 == 0) | (uint)lVar28)
              ;
              local_d0 = "Dimension %c needs to appear %d more times in the indexing template\n";
LAB_001072bf:
              bVar10 = false;
              snprintf(pcVar3 + iVar14,0x400 - (long)iVar14,local_d0,(ulong)(uint)(int)(char)bVar11,
                       (ulong)uVar23);
              local_c8 = (str)0x10005;
            }
            else {
              bVar10 = true;
              if (iVar13 < iVar22) {
                *(undefined8 *)(lVar27 + -0x300) =
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                ;
                *(undefined4 *)(lVar18 + -0x100) = 0xbb;
                iVar17 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
                if (idx2_err_code_s::NameMap.Arr[0].ItemVal != DimensionMismatched) {
                  lVar21 = 0x28;
                  do {
                    if (lVar21 == 0x3b8) {
                      iVar17 = __Invalid__;
                      goto LAB_00107216;
                    }
                    pcVar7 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar21);
                    lVar21 = lVar21 + 0x18;
                  } while (*pcVar7 != '\x05');
                  iVar17 = DimensionMismatched;
                }
LAB_00107216:
                pnVar15 = &idx2_err_code_s::NameMap;
                if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar17) {
                  lVar21 = 0;
                  do {
                    lVar19 = lVar21;
                    if (lVar19 == 0x390) goto LAB_001074ca;
                    lVar21 = lVar19 + 0x18;
                  } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar19] != iVar17);
                  pnVar15 = (name_map *)
                            ((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar19);
                }
                iVar14 = snprintf(pcVar3,0x400,"%.*s (file %s, line %d): ",
                                  (ulong)(uint)pnVar15->Arr[0].Name.Size,
                                  pnVar15->Arr[0].Name.field_0.Ptr,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                                  ,0xbb);
                bVar11 = pbVar16[lVar28 + 0x34];
                lVar28 = 0x3f;
                if (uVar25 != 0) {
                  for (; uVar25 >> lVar28 == 0; lVar28 = lVar28 + -1) {
                  }
                }
                lVar21 = 0x3f;
                if ((long)iVar13 != 0) {
                  for (; (ulong)(long)iVar13 >> lVar21 == 0; lVar21 = lVar21 + -1) {
                  }
                }
                uVar23 = (-(uint)(iVar22 == 0) | (uint)lVar28) -
                         (-(uint)(iVar13 == 0) | (uint)lVar21);
                local_d0 = "Dimension %c needs to appear %d fewer times in the indexing template\n";
                goto LAB_001072bf;
              }
            }
            if (!bVar10) break;
            lVar26 = lVar26 + 1;
            lVar28 = (Idx2->Dimensions).Size;
            bVar30 = lVar26 < lVar28;
          } while (lVar26 < lVar28);
        }
        if (!bVar30) {
          *(char **)(*in_FS_OFFSET + -0x300) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0xbf;
          local_c8._0_4_ = 0;
          local_d0 = "";
        }
      }
    }
  }
LAB_001073fd:
  if ((char)(uint)local_c8 != '\0') {
    cVar6 = (char)((uint)local_c8 >> 8);
    if ('?' < cVar6) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                    ,199,
                    "auto idx2::Finalize(idx2_file_v2 *)::(anonymous class)::operator()() const");
    }
    bVar12 = cVar6 + 1;
    uVar29 = (uint)local_c8 & 0xff00ff | (uint)bVar12 << 8;
    *(undefined4 *)(*in_FS_OFFSET + -0x100 + (long)(char)bVar12 * 4) = 199;
    *(char **)(*in_FS_OFFSET + -0x300 + (long)(char)bVar12 * 8) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    unaff_R14 = local_d0;
  }
  if ((char)(uint)local_c8 == '\0') {
    *(char **)(*in_FS_OFFSET + -0x300) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x100) = 0xca;
    uVar29 = 0;
    unaff_R14 = "";
  }
LAB_001074a8:
  uVar29 = uVar29 & 0xffffff;
  eVar31.Code = (char)uVar29;
  eVar31.StackIdx = (char)(uVar29 >> 8);
  eVar31.StrGened = (bool)(char)(uVar29 >> 0x10);
  eVar31._11_1_ = (char)(uVar29 >> 0x18);
  eVar31.Msg = unaff_R14;
  eVar31._12_4_ = 0;
  return eVar31;
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file_v2* Idx2)
{
  idx2_PropagateIfError(CheckDimensions(Idx2));
  idx2_PropagateIfError(ParseIndexingTemplate(Idx2));
  /* print the parsed indexing template */

  return idx2_Error(idx2_err_code::NoError);
}